

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.c
# Opt level: O3

void * calloc_array2(int height,int width,size_t SizeOfElements)

{
  void *__ptr;
  void *pvVar1;
  ulong uVar2;
  
  __ptr = calloc((long)height,8);
  if (__ptr == (void *)0x0) {
LAB_0012d6c3:
    __ptr = (void *)0x0;
  }
  else if (0 < height) {
    uVar2 = 0;
    do {
      pvVar1 = calloc((long)width,SizeOfElements);
      *(void **)((long)__ptr + uVar2 * 8) = pvVar1;
      if (pvVar1 == (void *)0x0) {
        uVar2 = 0;
        do {
          free(*(void **)((long)__ptr + uVar2 * 8));
          *(undefined8 *)((long)__ptr + uVar2 * 8) = 0;
          uVar2 = uVar2 + 1;
        } while ((uint)height != uVar2);
        free(__ptr);
        goto LAB_0012d6c3;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)height != uVar2);
  }
  return __ptr;
}

Assistant:

void* calloc_array2(int height, int width, size_t SizeOfElements)	
{
	int i = 0, ki = 0;
	void** p = NULL;

	p = (void**)calloc(height, sizeof(void*));
	if (p == NULL)	
	{
		return p;
	}

	for (i = 0; i < height; i++)	
	{
		p[i] = (void*)calloc(width, SizeOfElements);
		if (p[i] == NULL)	
		{
			for (ki = 0; ki < height; ki++)	
			{
				free(p[ki]); p[ki] = NULL;
			}
			free(p); p = NULL;
			return p;
		}
	}

	return p;
}